

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall Timer::Timer(Timer *this,timeType_ timeout,timeoutCallBack *callBack,int heapIndex)

{
  undefined8 uVar1;
  
  (this->timeout_).sec = timeout.sec;
  (this->timeout_).msec = timeout.msec;
  *(undefined8 *)&(this->callBack_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callBack_).super__Function_base._M_functor + 8) = 0;
  (this->callBack_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callBack_)._M_invoker = callBack->_M_invoker;
  if ((callBack->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(callBack->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->callBack_).super__Function_base._M_functor =
         *(undefined8 *)&(callBack->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->callBack_).super__Function_base._M_functor + 8) = uVar1;
    (this->callBack_).super__Function_base._M_manager = (callBack->super__Function_base)._M_manager;
    (callBack->super__Function_base)._M_manager = (_Manager_type)0x0;
    callBack->_M_invoker = (_Invoker_type)0x0;
  }
  this->heapIndex_ = heapIndex;
  return;
}

Assistant:

Timer::Timer(timeType_ timeout, timeoutCallBack callBack, int heapIndex)
    : timeout_(timeout), callBack_(std::move(callBack)), heapIndex_(heapIndex) {
}